

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::get_index<unsigned_char>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,
          CImg<unsigned_char> *colormap,float dithering,bool map_indexes)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  float *pfVar8;
  CImgArgumentException *this_00;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint *puVar12;
  float *pfVar13;
  byte *pbVar14;
  uint *puVar15;
  float *pfVar16;
  float *pfVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint *puVar21;
  uint uVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  byte *pbVar26;
  uint size_c;
  int iVar27;
  byte *pbVar28;
  int iVar29;
  uchar *ptrp_end_1;
  uchar *ptrp_end_2;
  uint *puVar30;
  long lVar31;
  char *pcVar32;
  int iVar33;
  long lVar34;
  float *pfVar35;
  long lVar36;
  uint *puVar37;
  long lVar38;
  long lVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  long local_110;
  uint *local_f8;
  Tfloat valm;
  CImg<unsigned_char> *local_e8;
  float local_e0;
  undefined4 uStack_dc;
  CImg<unsigned_int> *local_d8;
  uint *local_d0;
  float *local_c8;
  float *local_c0;
  long local_b8;
  float *local_b0;
  long local_a8;
  float *local_a0;
  long local_98;
  long local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  CImg<unsigned_int> local_70;
  CImg<float> cache;
  
  uVar19 = colormap->_spectrum;
  local_e8 = colormap;
  local_d8 = __return_storage_ptr__;
  if (uVar19 != this->_spectrum) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
    pcVar32 = "non-";
    if (this->_is_shared != false) {
      pcVar32 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::index(): Instance and specified colormap (%u,%u,%u,%u,%p) have incompatible dimensions."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar32,"unsigned int",(ulong)local_e8->_width,(ulong)local_e8->_height,
               (ulong)local_e8->_depth,(ulong)local_e8->_spectrum,local_e8->_data);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
  }
  if ((uVar19 != 0) && (this->_data != (uint *)0x0)) {
    uVar20 = this->_width;
    if (uVar20 != 0) {
      uVar22 = this->_height;
      if (uVar22 != 0) {
        uVar3 = this->_depth;
        if (uVar3 != 0) {
          lVar38 = (ulong)uVar22 * (ulong)uVar20 * (ulong)uVar3;
          lVar36 = (ulong)colormap->_depth * (ulong)colormap->_height * (ulong)colormap->_width;
          size_c = 1;
          if (map_indexes) {
            size_c = uVar19;
          }
          CImg(__return_storage_ptr__,uVar20,uVar22,uVar3,size_c);
          puVar37 = __return_storage_ptr__->_data;
          if (dithering <= 0.0) {
            uVar19 = this->_depth;
            uVar20 = this->_spectrum;
            if (uVar20 == 1) {
              if ((int)uVar19 < 1) {
                return local_d8;
              }
              puVar5 = this->_data;
              uVar20 = this->_height;
              lVar38 = 0;
              do {
                if (0 < (int)uVar20) {
                  pbVar4 = local_e8->_data;
                  lVar9 = 0;
                  do {
                    uVar10 = (ulong)this->_width;
                    if (uVar10 != 0) {
                      puVar7 = puVar5 + (ulong)((int)lVar9 * this->_width) +
                                        (ulong)uVar20 * lVar38 * uVar10;
                      puVar1 = puVar7 + uVar10;
                      puVar30 = puVar37 + lVar9 * (ulong)local_d8->_width +
                                          (ulong)local_d8->_height *
                                          (ulong)local_d8->_width * lVar38;
                      do {
                        pbVar28 = pbVar4;
                        if (0 < lVar36) {
                          fVar40 = 3.4e+38;
                          pbVar26 = pbVar4;
                          do {
                            fVar41 = ((float)*pbVar26 - (float)*puVar7) *
                                     ((float)*pbVar26 - (float)*puVar7);
                            if (fVar41 < fVar40) {
                              pbVar28 = pbVar26;
                            }
                            pbVar26 = pbVar26 + 1;
                            if (fVar40 <= fVar41) {
                              fVar41 = fVar40;
                            }
                            fVar40 = fVar41;
                          } while (pbVar26 < pbVar4 + lVar36);
                        }
                        if (map_indexes) {
                          uVar19 = (uint)*pbVar28;
                        }
                        else {
                          uVar19 = (int)pbVar28 - (int)pbVar4;
                        }
                        puVar7 = puVar7 + 1;
                        *puVar30 = uVar19;
                        puVar30 = puVar30 + 1;
                      } while (puVar7 < puVar1);
                      uVar20 = this->_height;
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < (int)uVar20);
                  uVar19 = this->_depth;
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 < (int)uVar19);
              return local_d8;
            }
            if (uVar20 == 2) {
              if ((int)uVar19 < 1) {
                return local_d8;
              }
              puVar5 = this->_data;
              uVar20 = this->_height;
              lVar9 = 0;
              do {
                if (0 < (int)uVar20) {
                  pbVar4 = local_e8->_data;
                  lVar39 = 0;
                  do {
                    uVar10 = (ulong)this->_width;
                    if (uVar10 != 0) {
                      puVar7 = puVar5 + (ulong)((int)lVar39 * this->_width) +
                                        (ulong)uVar20 * lVar9 * uVar10;
                      puVar1 = puVar7 + uVar10;
                      puVar30 = puVar7 + lVar38;
                      puVar12 = puVar37 + lVar39 * (ulong)local_d8->_width +
                                          (ulong)local_d8->_height * (ulong)local_d8->_width * lVar9
                      ;
                      puVar15 = puVar12 + lVar38;
                      do {
                        pbVar28 = pbVar4;
                        if (0 < lVar36) {
                          pbVar26 = pbVar4;
                          fVar40 = 3.4e+38;
                          do {
                            fVar41 = ((float)*pbVar26 - (float)*puVar7) *
                                     ((float)*pbVar26 - (float)*puVar7) +
                                     ((float)pbVar26[lVar36] - (float)*puVar30) *
                                     ((float)pbVar26[lVar36] - (float)*puVar30);
                            if (fVar41 < fVar40) {
                              pbVar28 = pbVar26;
                            }
                            pbVar26 = pbVar26 + 1;
                            if (fVar40 <= fVar41) {
                              fVar41 = fVar40;
                            }
                            fVar40 = fVar41;
                          } while (pbVar26 < pbVar4 + lVar36);
                        }
                        if (map_indexes) {
                          *puVar12 = (uint)*pbVar28;
                          *puVar15 = (uint)pbVar28[lVar36];
                          puVar15 = puVar15 + 1;
                        }
                        else {
                          *puVar12 = (int)pbVar28 - (int)pbVar4;
                        }
                        puVar7 = puVar7 + 1;
                        puVar30 = puVar30 + 1;
                        puVar12 = puVar12 + 1;
                      } while (puVar7 < puVar1);
                      uVar20 = this->_height;
                    }
                    lVar39 = lVar39 + 1;
                  } while (lVar39 < (int)uVar20);
                  uVar19 = this->_depth;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < (int)uVar19);
              return local_d8;
            }
            if (uVar20 != 3) {
              if ((int)uVar19 < 1) {
                return local_d8;
              }
              puVar5 = this->_data;
              uVar20 = this->_height;
              local_110 = 0;
              do {
                if (0 < (int)uVar20) {
                  pbVar4 = local_e8->_data;
                  lVar9 = 0;
                  do {
                    uVar10 = (ulong)this->_width;
                    if (uVar10 != 0) {
                      puVar7 = puVar5 + (ulong)((int)lVar9 * this->_width) +
                                        (ulong)uVar20 * local_110 * uVar10;
                      puVar1 = puVar7 + uVar10;
                      puVar30 = puVar37 + lVar9 * (ulong)local_d8->_width +
                                          (ulong)local_d8->_height *
                                          (ulong)local_d8->_width * local_110;
                      do {
                        pbVar28 = pbVar4;
                        if (0 < lVar36) {
                          fVar40 = 3.4e+38;
                          pbVar26 = pbVar4;
                          do {
                            fVar41 = 0.0;
                            pbVar14 = pbVar26;
                            puVar12 = puVar7;
                            uVar19 = this->_spectrum;
                            if (0 < (int)this->_spectrum) {
                              do {
                                fVar41 = fVar41 + ((float)*puVar12 - (float)*pbVar14) *
                                                  ((float)*puVar12 - (float)*pbVar14);
                                uVar19 = uVar19 - 1;
                                pbVar14 = pbVar14 + lVar36;
                                puVar12 = puVar12 + lVar38;
                              } while (uVar19 != 0);
                            }
                            pbVar14 = pbVar26;
                            if (fVar40 <= fVar41) {
                              pbVar14 = pbVar28;
                              fVar41 = fVar40;
                            }
                            fVar40 = fVar41;
                            pbVar28 = pbVar14;
                            pbVar26 = pbVar26 + 1;
                          } while (pbVar26 < pbVar4 + lVar36);
                        }
                        if (map_indexes) {
                          if (0 < (int)this->_spectrum) {
                            iVar27 = 0;
                            puVar12 = puVar30;
                            do {
                              *puVar12 = (uint)*pbVar28;
                              pbVar28 = pbVar28 + lVar36;
                              iVar27 = iVar27 + 1;
                              puVar12 = puVar12 + lVar38;
                            } while (iVar27 < (int)this->_spectrum);
                          }
                        }
                        else {
                          *puVar30 = (int)pbVar28 - (int)pbVar4;
                        }
                        puVar30 = puVar30 + 1;
                        puVar7 = puVar7 + 1;
                      } while (puVar7 < puVar1);
                      uVar20 = this->_height;
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < (int)uVar20);
                  uVar19 = this->_depth;
                }
                local_110 = local_110 + 1;
              } while (local_110 < (int)uVar19);
              return local_d8;
            }
            if ((int)uVar19 < 1) {
              return local_d8;
            }
            puVar5 = this->_data;
            uVar20 = this->_height;
            local_110 = 0;
            do {
              if (0 < (int)uVar20) {
                pbVar4 = local_e8->_data;
                lVar9 = 0;
                do {
                  uVar10 = (ulong)this->_width;
                  if (uVar10 != 0) {
                    puVar7 = puVar5 + (ulong)((int)lVar9 * this->_width) +
                                      (ulong)uVar20 * local_110 * uVar10;
                    puVar1 = puVar7 + uVar10;
                    puVar30 = puVar7 + lVar38;
                    puVar12 = puVar30 + lVar38;
                    puVar15 = puVar37 + lVar9 * (ulong)local_d8->_width +
                                        (ulong)local_d8->_height *
                                        (ulong)local_d8->_width * local_110;
                    puVar21 = puVar15 + lVar38;
                    puVar6 = puVar21 + lVar38;
                    do {
                      pbVar28 = pbVar4;
                      if (0 < lVar36) {
                        pbVar26 = pbVar4;
                        fVar40 = 3.4e+38;
                        do {
                          fVar41 = ((float)pbVar26[lVar36 * 2] - (float)*puVar12) *
                                   ((float)pbVar26[lVar36 * 2] - (float)*puVar12) +
                                   ((float)*pbVar26 - (float)*puVar7) *
                                   ((float)*pbVar26 - (float)*puVar7) +
                                   ((float)pbVar26[lVar36] - (float)*puVar30) *
                                   ((float)pbVar26[lVar36] - (float)*puVar30);
                          if (fVar41 < fVar40) {
                            pbVar28 = pbVar26;
                          }
                          pbVar26 = pbVar26 + 1;
                          if (fVar40 <= fVar41) {
                            fVar41 = fVar40;
                          }
                          fVar40 = fVar41;
                        } while (pbVar26 < pbVar4 + lVar36);
                      }
                      if (map_indexes) {
                        *puVar15 = (uint)*pbVar28;
                        *puVar21 = (uint)pbVar28[lVar36];
                        puVar21 = puVar21 + 1;
                        *puVar6 = (uint)pbVar28[lVar36 * 2];
                        puVar6 = puVar6 + 1;
                      }
                      else {
                        *puVar15 = (int)pbVar28 - (int)pbVar4;
                      }
                      puVar7 = puVar7 + 1;
                      puVar30 = puVar30 + 1;
                      puVar12 = puVar12 + 1;
                      puVar15 = puVar15 + 1;
                    } while (puVar7 < puVar1);
                    uVar20 = this->_height;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 < (int)uVar20);
                uVar19 = this->_depth;
              }
              local_110 = local_110 + 1;
            } while (local_110 < (int)uVar19);
            return local_d8;
          }
          valm = 0.0;
          puVar5 = max_min<float>(this,&valm);
          fVar40 = (float)*puVar5;
          if (((*puVar5 < 0x100) && (valm == fVar40)) && (0.0 <= valm)) {
            valm = 0.0;
            fVar40 = 255.0;
          }
          _local_e0 = CONCAT44(uStack_dc,fVar40);
          get_crop(&local_70,this,-1,0,0,0,this->_width,1,0,this->_spectrum - 1,false);
          CImg<float>::CImg<unsigned_int>(&cache,&local_70);
          fVar40 = 1.0;
          if (dithering <= 1.0) {
            fVar40 = dithering;
          }
          if ((local_70._is_shared == false) && (local_70._data != (uint *)0x0)) {
            operator_delete__(local_70._data);
          }
          fVar40 = fVar40 * 0.0625;
          pfVar25 = cache._data + 1;
          local_a0 = cache._data;
          pfVar35 = cache._data + (ulong)cache._width + 1;
          lVar9 = (ulong)cache._height * (ulong)cache._width * (ulong)cache._depth;
          uVar19 = this->_depth;
          uVar20 = this->_spectrum;
          if (uVar20 == 3) {
            if (0 < (int)uVar19) {
              local_f8 = puVar37 + lVar38;
              local_d0 = local_f8 + lVar38;
              pfVar8 = (float *)(ulong)this->_height;
              local_98 = lVar38 * 4;
              local_a8 = 0;
              lVar39 = 0;
              do {
                if (0 < (int)pfVar8) {
                  local_78 = this->_data;
                  pbVar4 = local_e8->_data;
                  uVar19 = this->_width;
                  local_80 = local_78 + lVar38;
                  local_88 = local_78 + lVar38 * 2;
                  iVar29 = 0;
                  iVar27 = 1;
                  pfVar17 = pfVar25;
                  uVar20 = uVar19;
                  do {
                    pfVar25 = pfVar35;
                    pfVar35 = pfVar17;
                    uVar22 = uVar20;
                    if (iVar29 < (int)pfVar8 + -2) {
                      if (0 < (int)uVar20) {
                        local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar29);
                        local_b8 = CONCAT44(local_b8._4_4_,iVar27);
                        lVar31 = (long)pfVar8 * local_a8 * (ulong)uVar20 +
                                 (ulong)(uVar20 * iVar27) * 4;
                        lVar34 = 0;
                        do {
                          pfVar25[lVar34] = (float)*(uint *)((long)local_78 + lVar34 * 4 + lVar31);
                          pfVar25[lVar9 + lVar34] =
                               (float)*(uint *)((long)local_80 + lVar34 * 4 + lVar31);
                          pfVar25[lVar9 * 2 + lVar34] =
                               (float)*(uint *)((long)local_88 + lVar34 * 4 + lVar31);
                          lVar34 = lVar34 + 1;
                          uVar22 = uVar19;
                          local_c0 = pfVar8;
                          local_b0 = pfVar35;
                        } while (uVar20 != (uint)lVar34);
                        goto LAB_0012eb77;
                      }
                    }
                    else {
LAB_0012eb77:
                      uVar20 = uVar22;
                      if (0 < (int)uVar22) {
                        local_b8 = CONCAT44(local_b8._4_4_,iVar27);
                        local_c8 = (float *)CONCAT44(local_c8._4_4_,iVar29);
                        pfVar8 = pfVar25 + lVar9;
                        pfVar17 = pfVar8 + lVar9;
                        pfVar16 = pfVar35 + lVar9;
                        pfVar23 = pfVar16 + lVar9;
                        iVar33 = 0;
                        pfVar13 = pfVar25;
                        pfVar24 = pfVar35;
                        do {
                          fVar41 = *pfVar24;
                          fVar42 = local_e0;
                          if (fVar41 <= local_e0) {
                            fVar42 = fVar41;
                          }
                          fVar43 = (float)(-(uint)(fVar41 < valm) & (uint)valm |
                                          ~-(uint)(fVar41 < valm) & (uint)fVar42);
                          fVar41 = *pfVar16;
                          fVar42 = local_e0;
                          if (fVar41 <= local_e0) {
                            fVar42 = fVar41;
                          }
                          fVar42 = (float)(-(uint)(fVar41 < valm) & (uint)valm |
                                          ~-(uint)(fVar41 < valm) & (uint)fVar42);
                          fVar41 = *pfVar23;
                          fVar44 = local_e0;
                          if (fVar41 <= local_e0) {
                            fVar44 = fVar41;
                          }
                          fVar41 = (float)(-(uint)(fVar41 < valm) & (uint)valm |
                                          ~-(uint)(fVar41 < valm) & (uint)fVar44);
                          pbVar28 = pbVar4;
                          if (0 < lVar36) {
                            fVar44 = 3.4e+38;
                            pbVar26 = pbVar4;
                            do {
                              fVar45 = ((float)pbVar26[lVar36 * 2] - fVar41) *
                                       ((float)pbVar26[lVar36 * 2] - fVar41) +
                                       ((float)*pbVar26 - fVar43) * ((float)*pbVar26 - fVar43) +
                                       ((float)pbVar26[lVar36] - fVar42) *
                                       ((float)pbVar26[lVar36] - fVar42);
                              if (fVar45 < fVar44) {
                                pbVar28 = pbVar26;
                              }
                              pbVar26 = pbVar26 + 1;
                              if (fVar44 <= fVar45) {
                                fVar45 = fVar44;
                              }
                              fVar44 = fVar45;
                            } while (pbVar26 < pbVar4 + lVar36);
                          }
                          *pfVar24 = fVar43;
                          bVar2 = *pbVar28;
                          *pfVar16 = fVar42;
                          fVar43 = (fVar43 - (float)bVar2) * fVar40;
                          fVar42 = (fVar42 - (float)pbVar28[lVar36]) * fVar40;
                          *pfVar23 = fVar41;
                          fVar41 = (fVar41 - (float)pbVar28[lVar36 * 2]) * fVar40;
                          pfVar24[1] = fVar43 * 7.0 + pfVar24[1];
                          pfVar16[1] = fVar42 * 7.0 + pfVar16[1];
                          pfVar23[1] = fVar41 * 7.0 + pfVar23[1];
                          pfVar13[-1] = fVar43 * 3.0 + pfVar13[-1];
                          pfVar8[-1] = fVar42 * 3.0 + pfVar8[-1];
                          pfVar17[-1] = fVar41 * 3.0 + pfVar17[-1];
                          *pfVar13 = fVar43 * 5.0 + *pfVar13;
                          *pfVar8 = fVar42 * 5.0 + *pfVar8;
                          *pfVar17 = fVar41 * 5.0 + *pfVar17;
                          pfVar13[1] = fVar43 + pfVar13[1];
                          pfVar8[1] = fVar42 + pfVar8[1];
                          pfVar17[1] = fVar41 + pfVar17[1];
                          if (map_indexes) {
                            *puVar37 = (uint)*pbVar28;
                            *local_f8 = (uint)pbVar28[lVar36];
                            local_f8 = local_f8 + 1;
                            *local_d0 = (uint)pbVar28[lVar36 * 2];
                            local_d0 = local_d0 + 1;
                          }
                          else {
                            local_110._0_4_ = (int)pbVar4;
                            *puVar37 = (int)pbVar28 - (int)local_110;
                          }
                          pfVar24 = pfVar24 + 1;
                          pfVar16 = pfVar16 + 1;
                          pfVar23 = pfVar23 + 1;
                          pfVar13 = pfVar13 + 1;
                          pfVar8 = pfVar8 + 1;
                          pfVar17 = pfVar17 + 1;
                          puVar37 = puVar37 + 1;
                          iVar33 = iVar33 + 1;
                          uVar19 = this->_width;
                        } while (iVar33 < (int)uVar19);
                        pfVar8 = (float *)(ulong)this->_height;
                        uVar20 = uVar19;
                        local_c0 = pfVar25;
                        local_b0 = pfVar35;
                      }
                    }
                    iVar29 = iVar29 + 1;
                    iVar27 = iVar27 + 1;
                    pfVar17 = pfVar25;
                  } while (iVar29 < (int)pfVar8);
                  uVar19 = this->_depth;
                  local_90 = lVar39;
                }
                lVar39 = lVar39 + 1;
                local_a8 = local_a8 + 4;
              } while (lVar39 < (int)uVar19);
            }
          }
          else if (uVar20 == 2) {
            if (0 < (int)uVar19) {
              puVar5 = puVar37 + lVar38;
              uVar20 = this->_height;
              local_d0 = (uint *)0x0;
              do {
                if (0 < (int)uVar20) {
                  local_c8 = (float *)this->_data;
                  pbVar4 = local_e8->_data;
                  uVar19 = this->_width;
                  iVar27 = 0;
                  pfVar8 = pfVar25;
                  do {
                    pfVar25 = pfVar35;
                    pfVar35 = pfVar8;
                    if (iVar27 < (int)(uVar20 - 2)) {
                      if (0 < (int)uVar19) {
                        pfVar8 = local_c8 +
                                 (ulong)((iVar27 + 1) * uVar19) +
                                 (ulong)uVar19 * (ulong)uVar20 * (long)local_d0;
                        pfVar17 = pfVar25;
                        uVar22 = uVar19;
                        do {
                          *pfVar17 = (float)(uint)*pfVar8;
                          pfVar16 = pfVar8 + lVar38;
                          pfVar8 = pfVar8 + 1;
                          pfVar17[lVar9] = (float)(uint)*pfVar16;
                          pfVar17 = pfVar17 + 1;
                          uVar22 = uVar22 - 1;
                        } while (uVar22 != 0);
                        goto LAB_0012e7e0;
                      }
                    }
                    else {
LAB_0012e7e0:
                      if (0 < (int)uVar19) {
                        pfVar8 = pfVar25 + lVar9;
                        pfVar17 = pfVar35 + lVar9;
                        iVar29 = 0;
                        pfVar16 = pfVar35;
                        pfVar23 = pfVar25;
                        do {
                          fVar41 = *pfVar16;
                          fVar42 = local_e0;
                          if (fVar41 <= local_e0) {
                            fVar42 = fVar41;
                          }
                          fVar42 = (float)(-(uint)(fVar41 < valm) & (uint)valm |
                                          ~-(uint)(fVar41 < valm) & (uint)fVar42);
                          fVar41 = *pfVar17;
                          fVar43 = local_e0;
                          if (fVar41 <= local_e0) {
                            fVar43 = fVar41;
                          }
                          fVar41 = (float)(-(uint)(fVar41 < valm) & (uint)valm |
                                          ~-(uint)(fVar41 < valm) & (uint)fVar43);
                          pbVar28 = pbVar4;
                          if (0 < lVar36) {
                            pbVar26 = pbVar4;
                            fVar43 = 3.4e+38;
                            do {
                              fVar44 = ((float)*pbVar26 - fVar42) * ((float)*pbVar26 - fVar42) +
                                       ((float)pbVar26[lVar36] - fVar41) *
                                       ((float)pbVar26[lVar36] - fVar41);
                              if (fVar44 < fVar43) {
                                pbVar28 = pbVar26;
                              }
                              pbVar26 = pbVar26 + 1;
                              if (fVar43 <= fVar44) {
                                fVar44 = fVar43;
                              }
                              fVar43 = fVar44;
                            } while (pbVar26 < pbVar4 + lVar36);
                          }
                          *pfVar16 = fVar42;
                          fVar42 = (fVar42 - (float)*pbVar28) * fVar40;
                          *pfVar17 = fVar41;
                          fVar41 = (fVar41 - (float)pbVar28[lVar36]) * fVar40;
                          pfVar16[1] = fVar42 * 7.0 + pfVar16[1];
                          pfVar17[1] = fVar41 * 7.0 + pfVar17[1];
                          pfVar23[-1] = fVar42 * 3.0 + pfVar23[-1];
                          pfVar8[-1] = fVar41 * 3.0 + pfVar8[-1];
                          *pfVar23 = fVar42 * 5.0 + *pfVar23;
                          *pfVar8 = fVar41 * 5.0 + *pfVar8;
                          pfVar23[1] = fVar42 + pfVar23[1];
                          pfVar8[1] = fVar41 + pfVar8[1];
                          if (map_indexes) {
                            *puVar37 = (uint)*pbVar28;
                            *puVar5 = (uint)pbVar28[lVar36];
                            puVar5 = puVar5 + 1;
                          }
                          else {
                            *puVar37 = (int)pbVar28 - (int)pbVar4;
                          }
                          pfVar16 = pfVar16 + 1;
                          pfVar17 = pfVar17 + 1;
                          pfVar23 = pfVar23 + 1;
                          pfVar8 = pfVar8 + 1;
                          puVar37 = puVar37 + 1;
                          iVar29 = iVar29 + 1;
                          uVar19 = this->_width;
                        } while (iVar29 < (int)uVar19);
                        uVar20 = this->_height;
                        local_c0 = pfVar25;
                      }
                    }
                    iVar27 = iVar27 + 1;
                    pfVar8 = pfVar25;
                  } while (iVar27 < (int)uVar20);
                  uVar19 = this->_depth;
                }
                local_d0 = (uint *)((long)local_d0 + 1);
              } while ((long)local_d0 < (long)(int)uVar19);
            }
          }
          else if (uVar20 == 1) {
            if (0 < (int)uVar19) {
              uVar20 = this->_height;
              lVar38 = 0;
              lVar9 = 0;
              do {
                if (0 < (int)uVar20) {
                  puVar5 = this->_data;
                  pbVar4 = local_e8->_data;
                  uVar19 = this->_width;
                  iVar27 = 0;
                  iVar29 = 1;
                  pfVar8 = pfVar35;
                  do {
                    pfVar35 = pfVar25;
                    pfVar25 = pfVar8;
                    if (iVar27 < (int)(uVar20 - 2)) {
                      if (0 < (int)uVar19) {
                        lVar39 = 0;
                        do {
                          pfVar25[lVar39] =
                               (float)*(uint *)((long)puVar5 +
                                               lVar39 * 4 +
                                               (ulong)uVar20 * lVar38 * (ulong)uVar19 +
                                               (ulong)(uVar19 * iVar29) * 4);
                          lVar39 = lVar39 + 1;
                        } while (uVar19 != (uint)lVar39);
                        goto LAB_0012dfba;
                      }
                    }
                    else {
LAB_0012dfba:
                      if (0 < (int)uVar19) {
                        iVar33 = 0;
                        pfVar8 = pfVar35;
                        pfVar17 = pfVar25;
                        do {
                          fVar41 = *pfVar8;
                          fVar42 = local_e0;
                          if (fVar41 <= local_e0) {
                            fVar42 = fVar41;
                          }
                          fVar41 = (float)(-(uint)(fVar41 < valm) & (uint)valm |
                                          ~-(uint)(fVar41 < valm) & (uint)fVar42);
                          pbVar28 = pbVar4;
                          if (0 < lVar36) {
                            pbVar26 = pbVar4;
                            fVar42 = 3.4e+38;
                            do {
                              fVar43 = ((float)*pbVar26 - fVar41) * ((float)*pbVar26 - fVar41);
                              if (fVar43 < fVar42) {
                                pbVar28 = pbVar26;
                              }
                              pbVar26 = pbVar26 + 1;
                              if (fVar42 <= fVar43) {
                                fVar43 = fVar42;
                              }
                              fVar42 = fVar43;
                            } while (pbVar26 < pbVar4 + lVar36);
                          }
                          *pfVar8 = fVar41;
                          fVar41 = (fVar41 - (float)*pbVar28) * fVar40;
                          pfVar8[1] = fVar41 * 7.0 + pfVar8[1];
                          pfVar17[-1] = fVar41 * 3.0 + pfVar17[-1];
                          *pfVar17 = fVar41 * 5.0 + *pfVar17;
                          pfVar17[1] = fVar41 + pfVar17[1];
                          if (map_indexes) {
                            uVar19 = (uint)*pbVar28;
                          }
                          else {
                            uVar19 = (int)pbVar28 - (int)pbVar4;
                          }
                          pfVar8 = pfVar8 + 1;
                          pfVar17 = pfVar17 + 1;
                          *puVar37 = uVar19;
                          puVar37 = puVar37 + 1;
                          iVar33 = iVar33 + 1;
                          uVar19 = this->_width;
                        } while (iVar33 < (int)uVar19);
                        uVar20 = this->_height;
                      }
                    }
                    iVar27 = iVar27 + 1;
                    iVar29 = iVar29 + 1;
                    pfVar8 = pfVar35;
                  } while (iVar27 < (int)uVar20);
                  uVar19 = this->_depth;
                }
                lVar9 = lVar9 + 1;
                lVar38 = lVar38 + 4;
              } while (lVar9 < (int)uVar19);
            }
          }
          else if (0 < (int)uVar19) {
            uVar20 = this->_height;
            local_b8 = 0;
            lVar39 = 0;
            do {
              if (0 < (int)uVar20) {
                local_b0 = (float *)this->_data;
                pbVar4 = local_e8->_data;
                iVar29 = 0;
                iVar27 = 1;
                pfVar8 = pfVar35;
                do {
                  pfVar35 = pfVar25;
                  pfVar25 = pfVar8;
                  local_d0 = (uint *)CONCAT44(local_d0._4_4_,iVar27);
                  if (iVar29 < (int)(uVar20 - 2)) {
                    uVar22 = this->_spectrum;
                    uVar19 = this->_width;
                    if (0 < (long)(int)uVar22) {
                      uVar3 = this->_depth;
                      lVar34 = (ulong)uVar20 * (ulong)uVar19 * local_b8 +
                               (ulong)(uVar19 * iVar27) * 4 + (long)local_b0;
                      lVar31 = 0;
                      pfVar8 = pfVar25;
                      do {
                        if (0 < (int)uVar19) {
                          lVar18 = 0;
                          do {
                            pfVar8[lVar18] = (float)*(uint *)(lVar34 + lVar18 * 4);
                            lVar18 = lVar18 + 1;
                          } while (uVar19 != (uint)lVar18);
                        }
                        lVar31 = lVar31 + 1;
                        lVar34 = lVar34 + (ulong)uVar20 * (ulong)uVar19 * (ulong)uVar3 * 4;
                        pfVar8 = pfVar8 + lVar9;
                      } while (lVar31 != (int)uVar22);
                    }
                  }
                  else {
                    uVar19 = this->_width;
                  }
                  if (0 < (int)uVar19) {
                    iVar33 = 0;
                    pfVar8 = pfVar35;
                    pfVar17 = pfVar25;
                    do {
                      uVar19 = this->_spectrum;
                      pbVar28 = pbVar4;
                      if (0 < lVar36) {
                        pbVar26 = pbVar4;
                        fVar41 = 3.4e+38;
                        do {
                          fVar42 = 0.0;
                          pbVar14 = pbVar26;
                          pfVar16 = pfVar8;
                          uVar20 = uVar19;
                          if (0 < (int)uVar19) {
                            do {
                              fVar43 = *pfVar16;
                              fVar44 = local_e0;
                              if (fVar43 <= local_e0) {
                                fVar44 = fVar43;
                              }
                              fVar43 = (float)(-(uint)(fVar43 < valm) & (uint)valm |
                                              ~-(uint)(fVar43 < valm) & (uint)fVar44);
                              *pfVar16 = fVar43;
                              fVar43 = fVar43 - (float)*pbVar14;
                              fVar42 = fVar42 + fVar43 * fVar43;
                              uVar20 = uVar20 - 1;
                              pbVar14 = pbVar14 + lVar36;
                              pfVar16 = pfVar16 + lVar9;
                            } while (uVar20 != 0);
                          }
                          pbVar14 = pbVar26;
                          if (fVar41 <= fVar42) {
                            fVar42 = fVar41;
                            pbVar14 = pbVar28;
                          }
                          pbVar28 = pbVar14;
                          pbVar26 = pbVar26 + 1;
                          fVar41 = fVar42;
                        } while (pbVar26 < pbVar4 + lVar36);
                      }
                      if ((int)uVar19 < 1) {
                        if (!map_indexes) goto LAB_0012f0c5;
                      }
                      else {
                        lVar31 = 4;
                        pbVar26 = pbVar28;
                        uVar20 = uVar19;
                        do {
                          fVar42 = (*(float *)((long)pfVar8 + lVar31 + -4) - (float)*pbVar26) *
                                   fVar40;
                          *(float *)((long)pfVar8 + lVar31) =
                               fVar42 * 7.0 + *(float *)((long)pfVar8 + lVar31);
                          pfVar16 = (float *)((long)pfVar17 + lVar31 + -8);
                          fVar41 = pfVar16[1];
                          pfVar23 = (float *)((long)pfVar17 + lVar31 + -8);
                          *pfVar23 = fVar42 * 3.0 + *pfVar16;
                          pfVar23[1] = fVar42 * 5.0 + fVar41;
                          *(float *)((long)pfVar17 + lVar31) =
                               fVar42 + *(float *)((long)pfVar17 + lVar31);
                          pbVar26 = pbVar26 + lVar36;
                          lVar31 = lVar31 + lVar9 * 4;
                          uVar20 = uVar20 - 1;
                        } while (uVar20 != 0);
                        if (map_indexes) {
                          if (0 < (int)uVar19) {
                            iVar11 = 0;
                            puVar5 = puVar37;
                            do {
                              *puVar5 = (uint)*pbVar28;
                              pbVar28 = pbVar28 + lVar36;
                              iVar11 = iVar11 + 1;
                              puVar5 = puVar5 + lVar38;
                            } while (iVar11 < (int)this->_spectrum);
                          }
                        }
                        else {
LAB_0012f0c5:
                          local_110._0_4_ = (int)pbVar4;
                          *puVar37 = (int)pbVar28 - (int)local_110;
                        }
                      }
                      pfVar8 = pfVar8 + 1;
                      pfVar17 = pfVar17 + 1;
                      puVar37 = puVar37 + 1;
                      iVar33 = iVar33 + 1;
                    } while (iVar33 < (int)this->_width);
                    uVar20 = this->_height;
                  }
                  iVar29 = iVar29 + 1;
                  iVar27 = iVar27 + 1;
                  pfVar8 = pfVar35;
                } while (iVar29 < (int)uVar20);
                uVar19 = this->_depth;
                local_c8 = pfVar35;
                local_c0 = pfVar25;
                local_a8 = lVar39;
              }
              lVar39 = lVar39 + 1;
              local_b8 = local_b8 + 4;
            } while (lVar39 < (int)uVar19);
          }
          if (cache._data == (float *)0x0 || cache._is_shared != false) {
            return local_d8;
          }
          operator_delete__(cache._data);
          return local_d8;
        }
      }
    }
  }
  __return_storage_ptr__->_data = (uint *)0x0;
  __return_storage_ptr__->_width = 0;
  __return_storage_ptr__->_height = 0;
  __return_storage_ptr__->_depth = 0;
  __return_storage_ptr__->_spectrum = 0;
  __return_storage_ptr__->_is_shared = false;
  return __return_storage_ptr__;
}

Assistant:

CImg<typename CImg<t>::Tuint>
    get_index(const CImg<t>& colormap, const float dithering=1, const bool map_indexes=true) const {
      if (colormap._spectrum!=_spectrum)
        throw CImgArgumentException(_cimg_instance
                                    "index(): Instance and specified colormap (%u,%u,%u,%u,%p) "
                                    "have incompatible dimensions.",
                                    cimg_instance,
                                    colormap._width,colormap._height,colormap._depth,colormap._spectrum,colormap._data);

      typedef typename CImg<t>::Tuint tuint;
      if (is_empty()) return CImg<tuint>();
      const unsigned long whd = (unsigned long)_width*_height*_depth, pwhd = (unsigned long)colormap._width*colormap._height*colormap._depth;
      CImg<tuint> res(_width,_height,_depth,map_indexes?_spectrum:1);
      tuint *ptrd = res._data;
      if (dithering>0) { // Dithered versions.
        const float ndithering = (dithering<0?0:dithering>1?1:dithering)/16;
        Tfloat valm = 0, valM = (Tfloat)max_min(valm);
        if (valm==valM && valm>=0 && valM<=255) { valm = 0; valM = 255; }
        CImg<Tfloat> cache = get_crop(-1,0,0,0,_width,1,0,_spectrum-1);
        Tfloat *cache_current = cache.data(1,0,0,0), *cache_next = cache.data(1,1,0,0);
        const unsigned long cwhd = (unsigned long)cache._width*cache._height*cache._depth;
        switch (_spectrum) {
        case 1 : { // Optimized for scalars.
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next; const T *ptrs0 = data(0,y+1,z,0);
              cimg_forX(*this,x) *(ptrc0++) = (Tfloat)*(ptrs0++);
            }
            Tfloat *ptrs0 = cache_current, *ptrsn0 = cache_next;
            cimg_forX(*this,x) {
              const Tfloat _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp_end = ptrp0 + pwhd; ptrp0<ptrp_end; ) {
                const Tfloat pval0 = (Tfloat)*(ptrp0++) - val0, dist = pval0*pval0;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const Tfloat err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering;
              *ptrs0+=7*err0; *(ptrsn0-1)+=3*err0; *(ptrsn0++)+=5*err0; *ptrsn0+=err0;
              if (map_indexes) *(ptrd++) = (tuint)*ptrmin0; else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 2 : { // Optimized for 2d vectors.
          tuint *ptrd1 = ptrd + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd;
              const T *ptrs0 = data(0,y+1,z,0), *ptrs1 = ptrs0 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1,
                  dist = pval0*pval0 + pval1*pval1;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering;
              *ptrs0+=7*err0; *ptrs1+=7*err1;
              *(ptrsn0-1)+=3*err0; *(ptrsn1-1)+=3*err1;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1;
              *ptrsn0+=err0; *ptrsn1+=err1;
              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 3 : { // Optimized for 3d vectors (colors).
          tuint *ptrd1 = ptrd + whd, *ptrd2 = ptrd1 + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd, *ptrc2 = ptrc1 + cwhd;
              const T *ptrs0 = data(0,y+1,z,0), *ptrs1 = ptrs0 + whd, *ptrs2 = ptrs1 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); *(ptrc2++) = (Tfloat)*(ptrs2++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd, *ptrs2 = ptrs1 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd, *ptrsn2 = ptrsn1 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1,
                _val2 = (Tfloat)*ptrs2, val2 = _val2<valm?valm:_val2>valM?valM:_val2;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp2 = ptrp1 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1, pval2 = (Tfloat)*(ptrp2++) - val2,
                  dist = pval0*pval0 + pval1*pval1 + pval2*pval2;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd, *const ptrmin2 = ptrmin1 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering,
                err2 = ((*(ptrs2++)=val2) - (Tfloat)*ptrmin2)*ndithering;

              *ptrs0+=7*err0; *ptrs1+=7*err1; *ptrs2+=7*err2;
              *(ptrsn0-1)+=3*err0; *(ptrsn1-1)+=3*err1; *(ptrsn2-1)+=3*err2;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1; *(ptrsn2++)+=5*err2;
              *ptrsn0+=err0; *ptrsn1+=err1; *ptrsn2+=err2;

              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; *(ptrd2++) = (tuint)*ptrmin2; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        default : // Generic version
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc = cache_next;
              cimg_forC(*this,c) {
                Tfloat *_ptrc = ptrc; const T *_ptrs = data(0,y+1,z,c);
                cimg_forX(*this,x) *(_ptrc++) = (Tfloat)*(_ptrs++);
                ptrc+=cwhd;
              }
            }
            Tfloat *ptrs = cache_current, *ptrsn = cache_next;
            cimg_forX(*this,x) {
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin = colormap._data;
              for (const t *ptrp = colormap._data, *ptrp_end = ptrp + pwhd; ptrp<ptrp_end; ++ptrp) {
                Tfloat dist = 0; Tfloat *_ptrs = ptrs; const t *_ptrp = ptrp;
                cimg_forC(*this,c) {
                  const Tfloat _val = *_ptrs, val = _val<valm?valm:_val>valM?valM:_val;
                  dist+=cimg::sqr((*_ptrs=val) - (Tfloat)*_ptrp); _ptrs+=cwhd; _ptrp+=pwhd;
                }
                if (dist<distmin) { ptrmin = ptrp; distmin = dist; }
              }
              const t *_ptrmin = ptrmin; Tfloat *_ptrs = ptrs++, *_ptrsn = (ptrsn++)-1;
              cimg_forC(*this,c) {
                const Tfloat err = (*(_ptrs++) - (Tfloat)*_ptrmin)*ndithering;
                *_ptrs+=7*err; *(_ptrsn++)+=3*err; *(_ptrsn++)+=5*err; *_ptrsn+=err;
                _ptrmin+=pwhd; _ptrs+=cwhd-1; _ptrsn+=cwhd-2;
              }
              if (map_indexes) {
                tuint *_ptrd = ptrd++;
                cimg_forC(*this,c) { *_ptrd = (tuint)*ptrmin; _ptrd+=whd; ptrmin+=pwhd; }
              }
              else *(ptrd++) = (tuint)(ptrmin - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        }